

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_context.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::context::apply_patches(context *this,transaction_base *t)

{
  list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  *this_00;
  uint uVar1;
  error_category *peVar2;
  error_category *extraout_RDX;
  ulong uVar3;
  _List_node_base *p_Var4;
  error_code eVar5;
  
  this_00 = &this->patches;
  p_Var4 = (_List_node_base *)this_00;
  do {
    p_Var4 = (((_List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)this_00) {
      std::__cxx11::
      _List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
      ::_M_clear(&this_00->
                  super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
                );
      (this->patches).
      super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
      (this->patches).
      super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
      (this->patches).
      super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
      ._M_impl._M_node._M_size = 0;
      uVar3 = 0;
      peVar2 = (error_category *)std::_V2::system_category();
      goto LAB_00172cf2;
    }
    uVar1 = (**(code **)(*(long *)p_Var4[1]._M_next + 0x10))(p_Var4[1]._M_next,t);
  } while (uVar1 == 0);
  uVar3 = (ulong)uVar1;
  peVar2 = extraout_RDX;
LAB_00172cf2:
  eVar5._M_cat = peVar2;
  eVar5._0_8_ = uVar3;
  return eVar5;
}

Assistant:

std::error_code apply_patches (transaction_base * const t) {
                    for (auto const & patch : patches) {
                        if (std::error_code const erc = (*patch) (t)) {
                            return erc;
                        }
                    }
                    // Ensure that we can't apply the patches more than once.
                    patches.clear ();
                    return {};
                }